

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

vector<FatEntry,_std::allocator<FatEntry>_> * __thiscall
FatSystem::getEntries
          (vector<FatEntry,_std::allocator<FatEntry>_> *__return_storage_ptr__,FatSystem *this,
          uint cluster,int *clusters,bool *hasFree)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  bool bVar7;
  bool local_2c1;
  int previousCluster;
  undefined1 local_27c [24];
  undefined1 local_264 [27];
  allocator local_249;
  string local_248;
  string local_228;
  allocator local_201;
  string local_200 [32];
  undefined1 local_1e0 [8];
  FatEntry entry;
  uint i;
  _Self local_118 [3];
  _Self local_100;
  char local_f8 [8];
  char buffer [32];
  unsigned_long_long address;
  int localBadEntries;
  int localFound;
  undefined1 local_c0 [3];
  bool localZero;
  FatFilename filename;
  vector<FatEntry,_std::allocator<FatEntry>_> entries;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  int iStack_38;
  bool isValid;
  int badEntries;
  int foundEntries;
  bool contiguous;
  bool isRoot;
  bool *hasFree_local;
  int *clusters_local;
  FatSystem *pFStack_18;
  uint cluster_local;
  FatSystem *this_local;
  
  bVar1 = false;
  iStack_38 = 0;
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  clusters_local._4_4_ = cluster;
  pFStack_18 = this;
  this_local = (FatSystem *)__return_storage_ptr__;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<FatEntry,_std::allocator<FatEntry>_>::vector
            ((vector<FatEntry,_std::allocator<FatEntry>_> *)
             &filename.letters.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FatFilename::FatFilename((FatFilename *)local_c0);
  if (clusters != (int *)0x0) {
    *clusters = 0;
  }
  if (hasFree != (bool *)0x0) {
    *hasFree = false;
  }
  if ((clusters_local._4_4_ == 0) && (this->type == 0)) {
    clusters_local._4_4_ = (uint)this->rootDirectory;
  }
  local_2c1 = false;
  if (this->type == 1) {
    local_2c1 = (ulong)clusters_local._4_4_ == this->rootDirectory;
  }
  bVar7 = (ulong)clusters_local._4_4_ == this->rootDirectory;
  bVar3 = validCluster(this,clusters_local._4_4_);
  if (bVar3) {
    do {
      bVar3 = false;
      address._4_4_ = 0;
      address._0_4_ = 0;
      buffer._24_8_ = clusterAddress(this,clusters_local._4_4_,local_2c1);
      local_100._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (key_type_conflict *)((long)&clusters_local + 4));
      local_118[0]._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar4 = std::operator!=(&local_100,local_118);
      if (bVar4) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"! Looping directory");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        break;
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict1 *)((long)&clusters_local + 4));
      for (entry.data.field_2._12_4_ = 0; uVar2 = clusters_local._4_4_,
          (ulong)(uint)entry.data.field_2._12_4_ < this->bytesPerCluster;
          entry.data.field_2._12_4_ = entry.data.field_2._12_4_ + 0x20) {
        readData(this,buffer._24_8_,local_f8,0x20);
        FatEntry::FatEntry((FatEntry *)local_1e0);
        entry.longName.field_2._M_local_buf[8] = buffer[3];
        entry.changeDate._16_8_ = buffer._24_8_;
        if (buffer[3] == '\x0f') {
          FatFilename::append((FatFilename *)local_c0,local_f8);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_200,local_f8,0xb,&local_201);
          std::__cxx11::string::operator=((string *)local_1e0,local_200);
          std::__cxx11::string::~string(local_200);
          std::allocator<char>::~allocator((allocator<char> *)&local_201);
          FatFilename::getFilename_abi_cxx11_(&local_228,(FatFilename *)local_c0);
          std::__cxx11::string::operator=
                    ((string *)(entry.shortName.field_2._M_local_buf + 8),(string *)&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          entry._64_8_ = ZEXT48((uint)buffer._20_4_);
          entry.longName.field_2._12_4_ =
               (uint)(ushort)buffer._18_2_ |
               (uint)(byte)buffer[0xd] << 0x18 | (uint)(byte)buffer[0xc] << 0x10;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_248,local_f8,0x20,&local_249);
          FatEntry::setData((FatEntry *)local_1e0,&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator((allocator<char> *)&local_249);
          bVar3 = FatEntry::isZero((FatEntry *)local_1e0);
          if (bVar3) {
            bVar3 = true;
          }
          else {
            bVar3 = FatEntry::isCorrect((FatEntry *)local_1e0);
            if ((bVar3) && (bVar3 = validCluster(this,entry.longName.field_2._12_4_), bVar3)) {
              FatDate::FatDate((FatDate *)local_264,buffer + 8);
              entry.creationDate.s = local_264._16_4_;
              entry.creationDate.y = local_264._20_4_;
              entry.size = local_264._0_8_;
              entry.creationDate.h = local_264._8_4_;
              entry.creationDate.i = local_264._12_4_;
              FatDate::FatDate((FatDate *)local_27c,buffer + 0xe);
              entry.changeDate.s = local_27c._16_4_;
              entry.changeDate.y = local_27c._20_4_;
              entry.creationDate.m = local_27c._0_4_;
              entry.creationDate.d = local_27c._4_4_;
              entry.changeDate.h = local_27c._8_4_;
              entry.changeDate.i = local_27c._12_4_;
              std::vector<FatEntry,_std::allocator<FatEntry>_>::push_back
                        ((vector<FatEntry,_std::allocator<FatEntry>_> *)
                         &filename.letters.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1e0
                        );
              address._4_4_ = address._4_4_ + 1;
              iStack_38 = iStack_38 + 1;
              bVar3 = false;
              bVar4 = false;
              if (!bVar7) {
                FatEntry::getFilename_abi_cxx11_((string *)&previousCluster,(FatEntry *)local_1e0);
                bVar3 = true;
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&previousCluster,".");
                bVar4 = false;
                if (bVar5) {
                  bVar4 = entry.longName.field_2._12_4_ == clusters_local._4_4_;
                }
              }
              if (bVar3) {
                std::__cxx11::string::~string((string *)&previousCluster);
              }
              if (bVar4) {
                bVar7 = true;
              }
            }
            else {
              address._0_4_ = (int)address + 1;
              visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
                   visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
            }
            bVar3 = false;
          }
        }
        buffer._24_8_ = buffer._24_8_ + 0x20;
        FatEntry::~FatEntry((FatEntry *)local_1e0);
      }
      if (local_2c1 == false) {
        clusters_local._4_4_ = nextCluster(this,clusters_local._4_4_,0);
      }
      else if ((ulong)(clusters_local._4_4_ + 1) < this->rootClusters) {
        clusters_local._4_4_ = clusters_local._4_4_ + 1;
      }
      else {
        clusters_local._4_4_ = 0xffffffff;
      }
      if (clusters != (int *)0x0) {
        *clusters = *clusters + 1;
      }
      if ((clusters_local._4_4_ == 0) || (bVar1)) {
        bVar1 = true;
        if (hasFree != (bool *)0x0) {
          *hasFree = true;
        }
        if (((bVar3) || (address._4_4_ == 0)) || (address._4_4_ <= (int)address)) {
          if ((address._4_4_ == 0) && (clusters != (int *)0x0)) {
            *clusters = *clusters + -1;
          }
          break;
        }
        clusters_local._4_4_ = uVar2 + 1;
      }
      if ((!bVar7) && (iStack_38 < visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_))
      {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "! Entries don\'t look good, this is maybe not a directory");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        memset(__return_storage_ptr__,0,0x18);
        std::vector<FatEntry,_std::allocator<FatEntry>_>::vector(__return_storage_ptr__);
        goto LAB_00125b8a;
      }
    } while (clusters_local._4_4_ != 0xffffffff);
    std::vector<FatEntry,_std::allocator<FatEntry>_>::vector
              (__return_storage_ptr__,
               (vector<FatEntry,_std::allocator<FatEntry>_> *)
               &filename.letters.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<FatEntry,_std::allocator<FatEntry>_>::vector(__return_storage_ptr__);
  }
LAB_00125b8a:
  FatFilename::~FatFilename((FatFilename *)local_c0);
  std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector
            ((vector<FatEntry,_std::allocator<FatEntry>_> *)
             &filename.letters.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &entries.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

vector<FatEntry> FatSystem::getEntries(unsigned int cluster, int *clusters, bool *hasFree)
{
    bool isRoot = false;
    bool contiguous = false;
    int foundEntries = 0;
    int badEntries = 0;
    bool isValid = false;
    set<unsigned int> visited;
    vector<FatEntry> entries;
    FatFilename filename;

    if (clusters != NULL) {
        *clusters = 0;
    }

    if (hasFree != NULL) {
        *hasFree = false;
    }

    if (cluster == 0 && type == FAT32) {
        cluster = rootDirectory;
    }

    isRoot = (type==FAT16 && cluster==rootDirectory);

    if (cluster == rootDirectory) {
        isValid = true;
    }

    if (!validCluster(cluster)) {
        return vector<FatEntry>();
    }

    do {
        bool localZero = false;
        int localFound = 0;
        int localBadEntries = 0;
        unsigned long long address = clusterAddress(cluster, isRoot);
        char buffer[FAT_ENTRY_SIZE];
        if (visited.find(cluster) != visited.end()) {
            cerr << "! Looping directory" << endl;
            break;
        }
        visited.insert(cluster);

        unsigned int i;
        for (i=0; i<bytesPerCluster; i+=sizeof(buffer)) {
            // Reading data
            readData(address, buffer, sizeof(buffer));

            // Creating entry
            FatEntry entry;

            entry.attributes = buffer[FAT_ATTRIBUTES];
            entry.address = address;

            if (entry.attributes == FAT_ATTRIBUTES_LONGFILE) {
                // Long file part
                filename.append(buffer);
            } else {
                entry.shortName = string(buffer, 11);
                entry.longName = filename.getFilename();
                entry.size = FAT_READ_LONG(buffer, FAT_FILESIZE)&0xffffffff;
                entry.cluster = (FAT_READ_SHORT(buffer, FAT_CLUSTER_LOW)&0xffff) | (FAT_READ_SHORT(buffer, FAT_CLUSTER_HIGH)<<16);
                entry.setData(string(buffer, sizeof(buffer)));

                if (!entry.isZero()) {
                    if (entry.isCorrect() && validCluster(entry.cluster)) {
                        entry.creationDate = FatDate(&buffer[FAT_CREATION_DATE]);
                        entry.changeDate = FatDate(&buffer[FAT_CHANGE_DATE]);
                        entries.push_back(entry);
                        localFound++;
                        foundEntries++;

                        if (!isValid && entry.getFilename() == "." && entry.cluster == cluster) {
                            isValid = true;
                        }
                    } else {
                        localBadEntries++;
                        badEntries++;
                    }

                    localZero = false;
                } else {
                    localZero = true;
                }
            }

            address += sizeof(buffer);
        }

        int previousCluster = cluster;

        if (isRoot) {
            if (cluster+1 < rootClusters) {
                cluster++;
            } else {
                cluster = FAT_LAST;
            }
        } else {
            cluster = nextCluster(cluster);
        }

        if (clusters) {
            (*clusters)++;
        }

        if (cluster == 0 || contiguous) {
            contiguous = true;

            if (hasFree != NULL) {
                *hasFree = true;
            }
            if (!localZero && localFound && localBadEntries<localFound) {
                cluster = previousCluster+1;
            } else {
                if (!localFound && clusters) {
                    (*clusters)--;
                }
                break;
            }
        }

        if (!isValid) {
            if (badEntries>foundEntries) {
                cerr << "! Entries don't look good, this is maybe not a directory" << endl;
                return vector<FatEntry>();
          }
        }
    } while (cluster != FAT_LAST);

    return entries;
}